

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

void __thiscall
OpenMesh::PolyConnectivity::delete_edge
          (PolyConnectivity *this,EdgeHandle _eh,bool _delete_isolated_vertices)

{
  bool bVar1;
  HalfedgeHandle HVar2;
  StatusInfo *pSVar3;
  BaseHandle local_2c;
  BaseHandle local_28;
  FaceHandle fh1;
  BaseHandle local_20;
  byte local_19;
  FaceHandle fh0;
  bool _delete_isolated_vertices_local;
  PolyConnectivity *this_local;
  EdgeHandle _eh_local;
  
  local_28 = _eh.super_BaseHandle.idx_;
  local_19 = _delete_isolated_vertices;
  _fh0 = this;
  fh1.super_BaseHandle.idx_ =
       (BaseHandle)ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,0);
  local_20.idx_ =
       (int)ArrayKernel::face_handle
                      (&this->super_ArrayKernel,(HalfedgeHandle)fh1.super_BaseHandle.idx_);
  HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
  local_2c.idx_ = (int)ArrayKernel::face_handle(&this->super_ArrayKernel,HVar2);
  bVar1 = BaseHandle::is_valid(&local_20);
  if (bVar1) {
    delete_face(this,(FaceHandle)local_20.idx_,(bool)(local_19 & 1));
  }
  bVar1 = BaseHandle::is_valid(&local_2c);
  if (bVar1) {
    delete_face(this,(FaceHandle)local_2c.idx_,(bool)(local_19 & 1));
  }
  bVar1 = BaseHandle::is_valid(&local_20);
  if ((!bVar1) && (bVar1 = BaseHandle::is_valid(&local_2c), !bVar1)) {
    bVar1 = ArrayKernel::has_edge_status(&this->super_ArrayKernel);
    if (bVar1) {
      pSVar3 = ArrayKernel::status(&this->super_ArrayKernel,_eh);
      Attributes::StatusInfo::set_deleted(pSVar3,true);
    }
    bVar1 = ArrayKernel::has_halfedge_status(&this->super_ArrayKernel);
    if (bVar1) {
      HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,0);
      pSVar3 = ArrayKernel::status(&this->super_ArrayKernel,HVar2);
      Attributes::StatusInfo::set_deleted(pSVar3,true);
      HVar2 = ArrayKernel::halfedge_handle(&this->super_ArrayKernel,_eh,1);
      pSVar3 = ArrayKernel::status(&this->super_ArrayKernel,HVar2);
      Attributes::StatusInfo::set_deleted(pSVar3,true);
    }
  }
  return;
}

Assistant:

void PolyConnectivity::delete_edge(EdgeHandle _eh, bool _delete_isolated_vertices)
{
  FaceHandle fh0(face_handle(halfedge_handle(_eh, 0)));
  FaceHandle fh1(face_handle(halfedge_handle(_eh, 1)));

  if (fh0.is_valid())  delete_face(fh0, _delete_isolated_vertices);
  if (fh1.is_valid())  delete_face(fh1, _delete_isolated_vertices);

  // If there is no face, we delete the edge
  // here
  if ( ! fh0.is_valid() && !fh1.is_valid()) {
    // mark edge deleted if the mesh has a edge status
    if ( has_edge_status() )
      status(_eh).set_deleted(true);

    // mark corresponding halfedges as deleted
    // As the deleted edge is boundary,
    // all corresponding halfedges will also be deleted.
    if ( has_halfedge_status() ) {
      status(halfedge_handle(_eh, 0)).set_deleted(true);
      status(halfedge_handle(_eh, 1)).set_deleted(true);
    }
  }
}